

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

char * basic_get(amqp_connection_state_t connection_state_,char *queue_name_,
                uint64_t *out_body_size_)

{
  amqp_flags_t aVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  amqp_bytes_t queue;
  amqp_time_t deadline;
  timeval timeout;
  amqp_message_t message;
  amqp_time_t local_180;
  timeval local_178;
  amqp_rpc_reply_t local_168;
  amqp_message_t local_148;
  
  local_178.tv_sec = 5;
  local_178.tv_usec = 0;
  iVar2 = amqp_time_from_now(&local_180,&local_178);
  if (iVar2 != 0) {
    __assert_fail("time_rc == AMQP_STATUS_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x5f,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  do {
    queue = amqp_cstring_bytes(queue_name_);
    amqp_basic_get((amqp_rpc_reply_t *)&local_148,connection_state_,1,queue,1);
    iVar2 = (int)local_148.properties.content_type.len;
    aVar1 = local_148.properties._flags;
    if ((local_148.properties._flags != 1) ||
       ((int)local_148.properties.content_type.len != 0x3c0048)) break;
    iVar3 = amqp_time_has_past(local_180);
  } while (iVar3 == 0);
  if (aVar1 != 1) {
    __assert_fail("rpc_reply.reply_type == AMQP_RESPONSE_NORMAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x68,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  if (iVar2 == 0x3c0047) {
    amqp_read_message(&local_168,connection_state_,1,&local_148,0);
    if (local_168.reply_type == AMQP_RESPONSE_NORMAL) {
      __dest = (char *)malloc(local_148.body.len);
      memcpy(__dest,local_148.body.bytes,local_148.body.len);
      *out_body_size_ = local_148.body.len;
      amqp_destroy_message(&local_148);
      return __dest;
    }
    __assert_fail("rpc_reply.reply_type == AMQP_RESPONSE_NORMAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x6e,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
  }
  __assert_fail("rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x69,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
}

Assistant:

char *basic_get(amqp_connection_state_t connection_state_,
                const char *queue_name_, uint64_t *out_body_size_) {
  amqp_rpc_reply_t rpc_reply;
  amqp_time_t deadline;
  struct timeval timeout = {5, 0};
  int time_rc = amqp_time_from_now(&deadline, &timeout);
  assert(time_rc == AMQP_STATUS_OK);

  do {
    rpc_reply = amqp_basic_get(connection_state_, fixed_channel_id,
                               amqp_cstring_bytes(queue_name_), /*no_ack*/ 1);
  } while (rpc_reply.reply_type == AMQP_RESPONSE_NORMAL &&
           rpc_reply.reply.id == AMQP_BASIC_GET_EMPTY_METHOD &&
           amqp_time_has_past(deadline) == AMQP_STATUS_OK);

  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);
  assert(rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD);

  amqp_message_t message;
  rpc_reply =
      amqp_read_message(connection_state_, fixed_channel_id, &message, 0);
  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);

  char *body = malloc(message.body.len);
  memcpy(body, message.body.bytes, message.body.len);
  *out_body_size_ = message.body.len;
  amqp_destroy_message(&message);

  return body;
}